

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O3

void __thiscall LiftLattice_Join_Test::TestBody(LiftLattice_Join_Test *this)

{
  char *pcVar1;
  char *in_R9;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  AssertHelper local_50;
  _Storage<bool,_true> local_42;
  bool bStack_41;
  internal iStack_40;
  undefined7 uStack_3f;
  Element top;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  _Storage<bool,_true> local_2c;
  bool bStack_2b;
  _Storage<bool,_true> local_2a;
  bool bStack_29;
  Element bot;
  AssertHelper AStack_28;
  Element lifteeBot;
  _Storage<bool,_true> local_1a;
  bool bStack_19;
  Element elem;
  
  _local_2c = 0;
  _local_2a = 0x100;
  _local_42 = 0x101;
  _local_1a = 0;
  testing::internal::
  CmpHelperEQ<wasm::analysis::Lift<wasm::analysis::Bool>::Element,wasm::analysis::Lift<wasm::analysis::Bool>::Element>
            ((internal *)local_70,"elem","bot",(Element *)&local_1a,(Element *)&local_2c);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x192,pcVar1);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT71(uStack_3f,iStack_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_3f,iStack_40) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (bStack_19 == false) {
    if (bStack_29 == false) goto LAB_00197e33;
    _local_1a = _local_2a;
  }
  else if (((bStack_29 == false) || (local_2a._M_value != true)) || (local_1a._M_value != false)) {
LAB_00197e33:
    iStack_40 = (internal)0x0;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,&stack0xffffffffffffffc0,
               (AssertionResult *)"lift.join(elem, lifteeBot)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x195,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_70._1_7_,local_70[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70[0]),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (AStack_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AStack_28.data_ + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  else {
    _local_1a = CONCAT11(bStack_19,1);
  }
  testing::internal::
  CmpHelperEQ<wasm::analysis::Lift<wasm::analysis::Bool>::Element,wasm::analysis::Lift<wasm::analysis::Bool>::Element>
            ((internal *)local_70,"elem","lifteeBot",(Element *)&local_1a,(Element *)&local_2a);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x196,pcVar1);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT71(uStack_3f,iStack_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_3f,iStack_40) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (bStack_19 == false) {
    if (bStack_2b != false) {
      _local_1a = _local_2c;
      goto LAB_00197fa9;
    }
  }
  else if (((bStack_2b != false) && (local_2c._M_value == true)) && (local_1a._M_value == false)) {
    _local_1a = CONCAT11(bStack_19,1);
LAB_00197fa9:
    iStack_40 = (internal)0x0;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,&stack0xffffffffffffffc0,(AssertionResult *)"lift.join(elem, bot)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x199,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_70._1_7_,local_70[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70[0]),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (AStack_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AStack_28.data_ + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  testing::internal::
  CmpHelperEQ<wasm::analysis::Lift<wasm::analysis::Bool>::Element,wasm::analysis::Lift<wasm::analysis::Bool>::Element>
            ((internal *)local_70,"elem","lifteeBot",(Element *)&local_1a,(Element *)&local_2a);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x19a,pcVar1);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT71(uStack_3f,iStack_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_3f,iStack_40) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (bStack_19 == false) {
    if (bStack_29 != false) {
      _local_1a = _local_2a;
      goto LAB_0019811e;
    }
  }
  else if (((bStack_29 != false) && (local_2a._M_value == true)) && (local_1a._M_value == false)) {
    _local_1a = CONCAT11(bStack_19,1);
LAB_0019811e:
    iStack_40 = (internal)0x0;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,&stack0xffffffffffffffc0,
               (AssertionResult *)"lift.join(elem, lifteeBot)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x19d,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_70._1_7_,local_70[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70[0]),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (AStack_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AStack_28.data_ + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  testing::internal::
  CmpHelperEQ<wasm::analysis::Lift<wasm::analysis::Bool>::Element,wasm::analysis::Lift<wasm::analysis::Bool>::Element>
            ((internal *)local_70,"elem","lifteeBot",(Element *)&local_1a,(Element *)&local_2a);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x19e,pcVar1);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT71(uStack_3f,iStack_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_3f,iStack_40) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (bStack_19 == false) {
    if (bStack_41 == false) goto LAB_0019828b;
    _local_1a = _local_42;
  }
  else if (((bStack_41 == false) || (local_42._M_value != true)) || (local_1a._M_value != false)) {
LAB_0019828b:
    iStack_40 = (internal)0x0;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,&stack0xffffffffffffffc0,(AssertionResult *)"lift.join(elem, top)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1a1,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_70._1_7_,local_70[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70[0]),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (AStack_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AStack_28.data_ + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  else {
    _local_1a = CONCAT11(bStack_19,1);
  }
  testing::internal::
  CmpHelperEQ<wasm::analysis::Lift<wasm::analysis::Bool>::Element,wasm::analysis::Lift<wasm::analysis::Bool>::Element>
            ((internal *)local_70,"elem","top",(Element *)&local_1a,(Element *)&local_42);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1a2,pcVar1);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT71(uStack_3f,iStack_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_3f,iStack_40) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (bStack_19 == false) {
    if (bStack_2b == false) goto LAB_001984a9;
    _local_1a = _local_2c;
  }
  else {
    if (((bStack_2b == false) || (local_2c._M_value != true)) || (local_1a._M_value != false))
    goto LAB_001984a9;
    _local_1a = CONCAT11(bStack_19,1);
  }
  iStack_40 = (internal)0x0;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&stack0xffffffffffffffd8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_70,&stack0xffffffffffffffc0,(AssertionResult *)"lift.join(elem, bot)",
             "true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
             ,0x1a5,(char *)CONCAT71(local_70._1_7_,local_70[0]));
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffffd8);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)CONCAT71(local_70._1_7_,local_70[0]) != &gtest_ar.message_) {
    operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70[0]),
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (AStack_28.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)AStack_28.data_ + 8))();
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
LAB_001984a9:
  testing::internal::
  CmpHelperEQ<wasm::analysis::Lift<wasm::analysis::Bool>::Element,wasm::analysis::Lift<wasm::analysis::Bool>::Element>
            ((internal *)local_70,"elem","top",(Element *)&local_1a,(Element *)&local_42);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1a6,pcVar1);
    testing::internal::AssertHelper::operator=
              (&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffd8);
    if ((long *)CONCAT71(uStack_3f,iStack_40) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_3f,iStack_40) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  return;
}

Assistant:

TEST(LiftLattice, Join) {
  analysis::Lift lift{analysis::Bool{}};
  auto bot = lift.getBottom();
  auto lifteeBot = lift.get(false);
  auto top = lift.get(true);

  // bot u bot = bot
  auto elem = bot;
  EXPECT_FALSE(lift.join(elem, bot));
  EXPECT_EQ(elem, bot);

  // bot u lifteeBot = lifteeBot
  EXPECT_TRUE(lift.join(elem, lifteeBot));
  EXPECT_EQ(elem, lifteeBot);

  // lifteeBot u bot = lifteeBot
  EXPECT_FALSE(lift.join(elem, bot));
  EXPECT_EQ(elem, lifteeBot);

  // lifteeBot u lifteeBot = lifteeBot
  EXPECT_FALSE(lift.join(elem, lifteeBot));
  EXPECT_EQ(elem, lifteeBot);

  // lifteeBot u top = top
  EXPECT_TRUE(lift.join(elem, top));
  EXPECT_EQ(elem, top);

  // top u bot = top
  EXPECT_FALSE(lift.join(elem, bot));
  EXPECT_EQ(elem, top);
}